

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void color_tree_cleanup(ColorTree *tree)

{
  int local_14;
  int i;
  ColorTree *tree_local;
  
  for (local_14 = 0; local_14 != 0x10; local_14 = local_14 + 1) {
    if (tree->children[local_14] != (ColorTree *)0x0) {
      color_tree_cleanup(tree->children[local_14]);
      lodepng_free(tree->children[local_14]);
    }
  }
  return;
}

Assistant:

static void color_tree_cleanup(ColorTree* tree)
{
  int i;
  for(i = 0; i != 16; ++i)
  {
    if(tree->children[i])
    {
      color_tree_cleanup(tree->children[i]);
      lodepng_free(tree->children[i]);
    }
  }
}